

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_state.cpp
# Opt level: O0

bool __thiscall
HookStateStepOut::Start(HookStateStepOut *this,shared_ptr<Debugger> *debugger,lua_State *current)

{
  bool bVar1;
  element_type *this_00;
  shared_ptr<Debugger> local_38;
  lua_State *local_28;
  lua_State *current_local;
  shared_ptr<Debugger> *debugger_local;
  HookStateStepOut *this_local;
  
  local_28 = current;
  current_local = (lua_State *)debugger;
  debugger_local = (shared_ptr<Debugger> *)this;
  std::shared_ptr<Debugger>::shared_ptr(&local_38,debugger);
  bVar1 = StackLevelBasedState::Start(&this->super_StackLevelBasedState,&local_38,local_28);
  std::shared_ptr<Debugger>::~shared_ptr(&local_38);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    this_00 = std::__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Debugger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         debugger);
    Debugger::ExitDebugMode(this_00);
  }
  return bVar1;
}

Assistant:

bool HookStateStepOut::Start(std::shared_ptr<Debugger> debugger, lua_State* current)
{
	if (!StackLevelBasedState::Start(debugger, current))
		return false;
	debugger->ExitDebugMode();
	return true;
}